

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O2

err_t dstuVerify(dstu_params *params,size_t ld,octet *hash,size_t hash_len,octet *sig,octet *pubkey)

{
  word *b;
  word *pwVar1;
  u64 *dest;
  u64 *dest_00;
  u64 *stack;
  octet *poVar2;
  byte *pbVar3;
  qr_o *pqVar4;
  ec_o *ec_00;
  err_t eVar5;
  bool_t bVar6;
  int iVar7;
  size_t sVar8;
  ulong count;
  size_t sVar9;
  ulong uVar10;
  word *a;
  ulong n;
  ec_o *ec;
  
  ec = (ec_o *)0x0;
  eVar5 = dstuEcCreate(&ec,params,dstuVerify_deep);
  ec_00 = ec;
  if (eVar5 == 0) {
    sVar8 = wwBitSize(ec->order,ec->f->n);
    bVar6 = memIsValid(pubkey,ec_00->f->no * 2);
    eVar5 = 0x6d;
    if (((((ld & 0xf) == 0) && (bVar6 != 0)) && (count = sVar8 + 7 >> 3, count * 0x10 <= ld)) &&
       (bVar6 = memIsValid(hash,hash_len), bVar6 != 0)) {
      a = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
      pqVar4 = ec_00->f;
      sVar9 = pqVar4->n;
      b = a + sVar9;
      pwVar1 = b + sVar9;
      dest = pwVar1 + sVar9;
      dest_00 = dest + sVar9;
      stack = dest_00 + sVar9;
      bVar6 = (*pqVar4->from)(b,pubkey,pqVar4,stack);
      eVar5 = 0x1f9;
      if (bVar6 != 0) {
        pqVar4 = ec_00->f;
        bVar6 = (*pqVar4->from)(pwVar1,pubkey + pqVar4->no,pqVar4,stack);
        if (bVar6 != 0) {
          uVar10 = ec_00->f->no;
          if (hash_len < uVar10) {
            memCopy(a,hash,hash_len);
            memSet((void *)((long)a + hash_len),'\0',ec_00->f->no - hash_len);
          }
          else {
            memCopy(a,hash,uVar10);
            sVar9 = gf2Deg(ec_00->f);
            pbVar3 = (byte *)((long)a + (ec_00->f->no - 1));
            *pbVar3 = *pbVar3 & ~(-1 << ((byte)sVar9 & 7));
          }
          (*ec_00->f->from)(a,(octet *)a,ec_00->f,stack);
          bVar6 = wwIsZero(a,ec_00->f->n);
          if (bVar6 != 0) {
            wwCopy(a,ec_00->f->unity,ec_00->f->n);
          }
          n = sVar8 + 0x3f >> 6;
          u64From(dest,sig,count);
          u64From(dest_00,sig + (ld >> 4),count);
          eVar5 = 0x1fe;
          uVar10 = count;
          while (uVar10 < ld >> 4) {
            if ((sig[uVar10] != '\0') ||
               (poVar2 = sig + (ld >> 4) + uVar10, uVar10 = uVar10 + 1, *poVar2 != '\0'))
            goto LAB_0013e677;
          }
          bVar6 = wwIsZero(dest,n);
          eVar5 = 0x1fe;
          if (((bVar6 == 0) && (bVar6 = wwIsZero(dest_00,n), bVar6 == 0)) &&
             ((iVar7 = wwCmp(dest,ec_00->order,n), iVar7 < 0 &&
              ((iVar7 = wwCmp(dest_00,ec_00->order,n), iVar7 < 0 &&
               (bVar6 = ecAddMulA(b,ec_00,stack,2,ec_00->base,dest_00,n,b,dest,n), bVar6 != 0))))))
          {
            (*ec_00->f->mul)(pwVar1,b,a,ec_00->f,stack);
            (*ec_00->f->to)((octet *)dest_00,pwVar1,ec_00->f,stack);
            u64From(dest_00,dest_00,count);
            wwTrimHi(dest_00,n,sVar8 - 1);
            bVar6 = wwEq(dest,dest_00,n);
            eVar5 = 0;
            if (bVar6 == 0) {
              eVar5 = 0x1fe;
            }
          }
        }
      }
    }
LAB_0013e677:
    blobClose(ec_00);
  }
  return eVar5;
}

Assistant:

err_t dstuVerify(const dstu_params* params, size_t ld, const octet hash[], 
	size_t hash_len, const octet sig[], const octet pubkey[])
{
	err_t code;
	size_t order_n, order_no, order_nb, i;
	// состояние
	ec_o* ec = 0;
	word* h;		/* хэш-значение как элемент поля */
	word* x;		/* х-координата эфемерного ок */
	word* y;		/* y-координата эфемерного ок */
	word* r;		/* первая часть ЭЦП */
	word* s;		/* вторая часть ЭЦП */
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuVerify_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	order_nb = wwBitSize(ec->order, ec->f->n);
	order_no = O_OF_B(order_nb);
	order_n = W_OF_B(order_nb);
	// проверить входные указатели
	// шаги 1, 2: обработка идентификатора хэш-функции
	// шаг 3: проверить ld
	if (!memIsValid(pubkey, 2 * ec->f->no) || 
		ld % 16 != 0 || ld < 16 * order_no ||
		!memIsValid(hash, hash_len))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	h = objEnd(ec, word);
	x = h + ec->f->n;
	y = x + ec->f->n;
	r = y + ec->f->n;
	s = r + ec->f->n;
	stack = s + ec->f->n;
	// шаг 4: проверить params
	// шаг 5: проверить pubkey
	// [минимальная проверка принадлежности координат базовому полю]
	if (!qrFrom(x, pubkey, ec->f, stack) || 
		!qrFrom(y, pubkey + ec->f->no, ec->f, stack))
	{
		dstuEcClose(ec);
		return ERR_BAD_PUBKEY;
	}
	// шаги 6, 7: хэширование
	// шаг 8: перевести hash в элемент основного поля h
	// [алгоритм из раздела 5.9 ДСТУ]
	if (hash_len < ec->f->no)
	{
		memCopy(h, hash, hash_len);
		memSetZero((octet*)h + hash_len, ec->f->no - hash_len);
	}
	else
	{
		memCopy(h, hash, ec->f->no);
		// memTrimHi(h, ec->f->no, gf2Deg(ec->f));
		((octet*)h)[ec->f->no - 1] &= (1 << gf2Deg(ec->f) % 8) - 1;
	}
	qrFrom(h, (octet*)h, ec->f, stack);
	// шаг 8: если h = 0, то h <- 1
	if (qrIsZero(h, ec->f))
		qrSetUnity(h, ec->f);
	// шаг 9: выделить части подписи
	wwFrom(r, sig, order_no);
	wwFrom(s, sig + ld / 16, order_no);
	for (i = order_no; i < ld / 16; ++i)
		if (sig[i] || sig[i + ld / 16])
		{
			dstuEcClose(ec);
			return ERR_BAD_SIG;
		}
	// шаги 10, 11: проверить r и s
	if (wwIsZero(r, order_n) ||
		wwIsZero(s, order_n) ||
		wwCmp(r, ec->order, order_n) >= 0 ||
		wwCmp(s, ec->order, order_n) >= 0)
	{
		dstuEcClose(ec);
		return ERR_BAD_SIG;
	}
	// шаг 12: R <- sP + rQ
	if (!ecAddMulA(x, ec, stack, 2, ec->base, s, order_n, x, r, order_n))
	{
		dstuEcClose(ec);
		return ERR_BAD_SIG;
	}
	// шаг 13: y <- h * x
	qrMul(y, x, h, ec->f, stack);
	// шаг 14: r' <- \bar{y}
	ASSERT(order_n <= ec->f->n);
	qrTo((octet*)s, y, ec->f, stack);
	wwFrom(s, s, order_no);
	wwTrimHi(s, order_n, order_nb - 1);
	// шаг 15:
	if (!wwEq(r, s, order_n))
		code = ERR_BAD_SIG;
	// все нормально
	dstuEcClose(ec);
	return code;
}